

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

float __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *name)

{
  unsigned_short *c_00;
  char *__nptr;
  double dVar1;
  undefined1 local_38 [8];
  stringc c;
  SAttribute *attr;
  unsigned_short *name_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  c._8_8_ = getAttributeByName(this,name);
  if ((SAttribute *)c._8_8_ == (SAttribute *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    c_00 = core::string<unsigned_short>::c_str(&((SAttribute *)c._8_8_)->Value);
    core::string<char>::string<unsigned_short>((string<char> *)local_38,c_00);
    __nptr = core::string<char>::c_str((string<char> *)local_38);
    dVar1 = atof(__nptr);
    this_local._4_4_ = (float)dVar1;
    core::string<char>::~string((string<char> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

float getAttributeValueAsFloat(const char_type* name) const
	{
		const SAttribute* attr = getAttributeByName(name);
		if (!attr)
			return 0;

		core::stringc c = attr->Value.c_str();
        return static_cast<float>(atof(c.c_str()));
        //return fast_atof(c.c_str());
	}